

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.H
# Opt level: O2

int Fl_Text_Editor::kf_copy(int param_1,Fl_Text_Editor *e)

{
  Fl_Text_Buffer *this;
  EVP_PKEY_CTX *dst;
  size_t sVar1;
  
  this = (e->super_Fl_Text_Display).mBuffer;
  if ((this->mPrimary).mSelected != false) {
    dst = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(this);
    if (*dst != (EVP_PKEY_CTX)0x0) {
      sVar1 = strlen((char *)dst);
      Fl::copy(dst,(EVP_PKEY_CTX *)(sVar1 & 0xffffffff));
    }
    free(dst);
    Fl_Text_Display::show_insert_position(&e->super_Fl_Text_Display);
  }
  return 1;
}

Assistant:

Fl_Text_Buffer* buffer() const { return mBuffer; }